

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O1

int vorbis_book_init_encode(codebook *c,static_codebook *s)

{
  uint uVar1;
  ogg_uint32_t *poVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  double dVar6;
  
  c->used_entries = 0;
  c->c = (static_codebook *)0x0;
  c->quantvals = 0;
  c->minval = 0;
  *(undefined8 *)&c->delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (float *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->dim = 0;
  c->entries = 0;
  c->c = s;
  lVar3 = s->entries;
  c->entries = lVar3;
  c->used_entries = lVar3;
  c->dim = s->dim;
  poVar2 = _make_words(s->lengthlist,lVar3,0);
  c->codelist = poVar2;
  lVar3 = _book_maptype1_quantvals(s);
  c->quantvals = (int)lVar3;
  uVar4 = (uint)s->q_min;
  dVar6 = (double)(uVar4 & 0x1fffff);
  if ((int)uVar4 < 0) {
    dVar6 = (double)((ulong)dVar6 | (ulong)DAT_001e7c80);
  }
  uVar4 = uVar4 >> 0x15 & 0x3ff;
  if (0x352 < uVar4) {
    uVar4 = 0x353;
  }
  if (uVar4 < 0x2d6) {
    uVar4 = 0x2d5;
  }
  dVar6 = ldexp(dVar6,uVar4 - 0x314);
  fVar5 = rintf((float)dVar6);
  c->minval = (int)fVar5;
  uVar4 = (uint)s->q_delta;
  dVar6 = (double)(uVar4 & 0x1fffff);
  if ((int)uVar4 < 0) {
    dVar6 = (double)((ulong)dVar6 | (ulong)DAT_001e7c80);
  }
  uVar1 = uVar4 >> 0x15 & 0x3ff;
  uVar4 = 0x353;
  if (uVar1 < 0x353) {
    uVar4 = uVar1;
  }
  uVar1 = 0x2d5;
  if (0x2d5 < uVar4) {
    uVar1 = uVar4;
  }
  dVar6 = ldexp(dVar6,uVar1 - 0x314);
  fVar5 = rintf((float)dVar6);
  c->delta = (int)fVar5;
  return 0;
}

Assistant:

int vorbis_book_init_encode(codebook *c,const static_codebook *s){

  memset(c,0,sizeof(*c));
  c->c=s;
  c->entries=s->entries;
  c->used_entries=s->entries;
  c->dim=s->dim;
  c->codelist=_make_words(s->lengthlist,s->entries,0);
  /* c->valuelist=_book_unquantize(s,s->entries,NULL); */
  c->quantvals=_book_maptype1_quantvals(s);
  c->minval=(int)rint(_float32_unpack(s->q_min));
  c->delta=(int)rint(_float32_unpack(s->q_delta));

  return(0);
}